

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O1

bool __thiscall COLLADASaxFWL::SceneLoader::end__scene(SceneLoader *this)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  UI_STRING *uis;
  UI *in_RSI;
  
  uVar2 = FilePartLoader::getObjectFlags(&this->super_FilePartLoader);
  uVar1 = 1;
  if ((uVar2 & 2) != 0) {
    iVar3 = IFilePartLoader::writer((IFilePartLoader *)this,in_RSI,uis);
    uVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))
                      ((long *)CONCAT44(extraout_var,iVar3),this->mCurrentScene);
  }
  if (this->mCurrentScene != (Scene *)0x0) {
    (*(this->mCurrentScene->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).
      super_Object._vptr_Object[1])();
  }
  FilePartLoader::finish(&this->super_FilePartLoader);
  return (bool)uVar1;
}

Assistant:

bool SceneLoader::end__scene()
    {
        bool success = true;
		if ( (getObjectFlags() & Loader::SCENE_FLAG) != 0 )
		{
			success = writer()->writeScene ( mCurrentScene );
		}
        delete mCurrentScene;
        finish();
        return success;
    }